

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_font_tt.c
# Opt level: O3

HPDF_STATUS OnWrite(HPDF_Dict obj,HPDF_Stream_conflict stream)

{
  void *pvVar1;
  long lVar2;
  HPDF_STATUS HVar3;
  char *pcVar4;
  char *out;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  char buf [128];
  char acStack_b8 [127];
  char local_39 [9];
  
  pcVar4 = acStack_b8;
  out = acStack_b8;
  pvVar1 = obj->attr;
  lVar2 = *(long *)(*(long *)((long)pvVar1 + 0x20) + 0xd0);
  HVar3 = HPDF_Stream_WriteEscapeName(stream,"Widths");
  if ((HVar3 == 0) && (HVar3 = HPDF_Stream_WriteStr(stream," [\n"), HVar3 == 0)) {
    uVar5 = (ulong)*(byte *)(lVar2 + 0x80);
    if (*(byte *)(lVar2 + 0x80) <= *(byte *)(lVar2 + 0x81)) {
      do {
        uVar6 = uVar5 + 1;
        pcVar4 = HPDF_IToA(pcVar4,(int)*(short *)(*(long *)((long)pvVar1 + 0x28) + -2 + uVar6 * 2),
                           local_39);
        *pcVar4 = ' ';
        out = pcVar4 + 1;
        if ((uVar6 & 0xf) == 0) {
          HPDF_StrCpy(pcVar4 + 1,"\n",local_39);
          HVar3 = HPDF_Stream_WriteStr(stream,acStack_b8);
          out = acStack_b8;
          if (HVar3 != 0) {
            return HVar3;
          }
        }
        bVar7 = uVar5 < *(byte *)(lVar2 + 0x81);
        pcVar4 = out;
        uVar5 = uVar6;
      } while (bVar7);
    }
    HPDF_StrCpy(out,"]\n",local_39);
    HVar3 = HPDF_Stream_WriteStr(stream,acStack_b8);
    if (HVar3 == 0) {
      HVar3 = (**(code **)(*(long *)((long)pvVar1 + 0x20) + 0xb8))
                        (*(long *)((long)pvVar1 + 0x20),stream);
    }
  }
  return HVar3;
}

Assistant:

static HPDF_STATUS
OnWrite  (HPDF_Dict    obj,
          HPDF_Stream  stream)
{
    HPDF_FontAttr attr = (HPDF_FontAttr)obj->attr;
    HPDF_BasicEncoderAttr encoder_attr =
                    (HPDF_BasicEncoderAttr)attr->encoder->attr;
    HPDF_UINT i;
    HPDF_STATUS ret;
    char buf[128];
    char *pbuf = buf;
    char *eptr = buf + 127;

    HPDF_PTRACE ((" HPDF_Font_OnWrite\n"));

    /* Widths entry */
    if ((ret = HPDF_Stream_WriteEscapeName (stream, "Widths")) != HPDF_OK)
        return ret;

    if ((ret = HPDF_Stream_WriteStr (stream, " [\012")) != HPDF_OK)
        return ret;

    for (i = encoder_attr->first_char; i <= encoder_attr->last_char; i++) {

        pbuf = HPDF_IToA (pbuf, attr->widths[i], eptr);
        *pbuf++ = ' ';

        if ((i + 1) % 16 == 0) {
            HPDF_StrCpy(pbuf, "\012", eptr);
            if ((ret = HPDF_Stream_WriteStr (stream, buf)) != HPDF_OK)
                return ret;
            pbuf = buf;
        }

    }

    HPDF_StrCpy (pbuf, "]\012", eptr);

    if ((ret = HPDF_Stream_WriteStr (stream, buf)) != HPDF_OK)
        return ret;

    return attr->encoder->write_fn (attr->encoder, stream);
}